

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

uint __thiscall Kernel::Clause::getNumeralWeight(Clause *this)

{
  bool bVar1;
  int iVar2;
  Elem ppLVar3;
  int v;
  int wD;
  int wN;
  bool haveRat;
  RealConstantType realVal;
  RationalConstantType ratVal;
  int w;
  anon_class_1_0_00000001 intWeight;
  IntegerConstantType intVal;
  Term *t;
  NonVariableIterator nvi;
  Literal *lit;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>
  *__range1;
  uint res;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  NonVariableIterator *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  Clause *in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9a;
  undefined1 in_stack_fffffffffffffe9b;
  int in_stack_fffffffffffffe9c;
  uint in_stack_fffffffffffffea4;
  Term *in_stack_fffffffffffffea8;
  TermList in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  anon_class_1_0_00000001 *in_stack_fffffffffffffef0;
  RationalConstantType local_f0;
  undefined4 local_cc;
  int local_c8;
  uint64_t local_b0;
  Term *local_a8;
  Term *local_58;
  undefined1 local_30 [24];
  undefined1 *local_18;
  uint local_c;
  
  local_c = 0;
  iterLits(in_stack_fffffffffffffe90);
  local_18 = local_30;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>
           *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>
         *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  while (bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffe80,
                                 (StlIter *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
        bVar1) {
    ppLVar3 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>
              ::StlIter::operator*((StlIter *)0x844b94);
    local_58 = &(*ppLVar3)->super_Term;
    bVar1 = Term::hasInterpretedConstants(local_58);
    if (bVar1) {
      NonVariableIterator::NonVariableIterator
                ((NonVariableIterator *)in_stack_fffffffffffffeb0._content,in_stack_fffffffffffffea8
                 ,SUB41(in_stack_fffffffffffffea4 >> 0x18,0));
      while (bVar1 = NonVariableIterator::hasNext((NonVariableIterator *)0x844bd9), bVar1) {
        in_stack_fffffffffffffeb0 =
             NonVariableIterator::next
                       ((NonVariableIterator *)
                        CONCAT44(in_stack_fffffffffffffe9c,
                                 CONCAT13(in_stack_fffffffffffffe9b,
                                          CONCAT12(in_stack_fffffffffffffe9a,
                                                   in_stack_fffffffffffffe98))));
        local_b0 = in_stack_fffffffffffffeb0._content;
        in_stack_fffffffffffffea8 = TermList::term((TermList *)0x844c1a);
        local_a8 = in_stack_fffffffffffffea8;
        in_stack_fffffffffffffea4 = Term::arity(in_stack_fffffffffffffea8);
        if ((in_stack_fffffffffffffea4 == 0) && (bVar1 = Term::isSort((Term *)0x844c57), !bVar1)) {
          IntegerConstantType::IntegerConstantType((IntegerConstantType *)0x844c92);
          bVar1 = Theory::tryInterpretConstant
                            ((Theory *)
                             CONCAT44(in_stack_fffffffffffffe9c,
                                      CONCAT13(in_stack_fffffffffffffe9b,
                                               CONCAT12(in_stack_fffffffffffffe9a,
                                                        in_stack_fffffffffffffe98))),
                             (Term *)in_stack_fffffffffffffe90,
                             (IntegerConstantType *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          if (bVar1) {
            in_stack_fffffffffffffe9c =
                 getNumeralWeight::anon_class_1_0_00000001::operator()
                           (in_stack_fffffffffffffef0,
                            (IntegerConstantType *)
                            CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
            if (0 < in_stack_fffffffffffffe9c) {
              local_c = in_stack_fffffffffffffe9c + local_c;
            }
            local_cc = 4;
            local_c8 = in_stack_fffffffffffffe9c;
          }
          else {
            RationalConstantType::RationalConstantType
                      ((RationalConstantType *)in_stack_fffffffffffffe90);
            RealConstantType::RealConstantType((RealConstantType *)0x844d4c);
            in_stack_fffffffffffffeef = 0;
            in_stack_fffffffffffffe9b =
                 Theory::tryInterpretConstant
                           ((Theory *)
                            CONCAT44(in_stack_fffffffffffffe9c,
                                     CONCAT13(in_stack_fffffffffffffe9b,
                                              CONCAT12(in_stack_fffffffffffffe9a,
                                                       in_stack_fffffffffffffe98))),
                            (Term *)in_stack_fffffffffffffe90,
                            (RationalConstantType *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            if ((bool)in_stack_fffffffffffffe9b) {
              in_stack_fffffffffffffeef = 1;
            }
            else {
              in_stack_fffffffffffffe9a =
                   Theory::tryInterpretConstant
                             ((Theory *)
                              CONCAT44(in_stack_fffffffffffffe9c,
                                       CONCAT13(in_stack_fffffffffffffe9b,
                                                CONCAT12(in_stack_fffffffffffffe9a,
                                                         in_stack_fffffffffffffe98))),
                              (Term *)in_stack_fffffffffffffe90,
                              (RealConstantType *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
              if ((bool)in_stack_fffffffffffffe9a) {
                RationalConstantType::RationalConstantType
                          ((RationalConstantType *)in_stack_fffffffffffffe90,
                           (RationalConstantType *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
                RationalConstantType::operator=
                          ((RationalConstantType *)in_stack_fffffffffffffe80,
                           (RationalConstantType *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
                RationalConstantType::~RationalConstantType
                          ((RationalConstantType *)in_stack_fffffffffffffe80);
                in_stack_fffffffffffffeef = 1;
              }
            }
            if ((in_stack_fffffffffffffeef & 1) == 0) {
              local_cc = 4;
            }
            else {
              in_stack_fffffffffffffe90 = (Clause *)RationalConstantType::numerator(&local_f0);
              iVar2 = getNumeralWeight::anon_class_1_0_00000001::operator()
                                (in_stack_fffffffffffffef0,
                                 (IntegerConstantType *)
                                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
              in_stack_fffffffffffffe8c = iVar2;
              in_stack_fffffffffffffe80 =
                   (NonVariableIterator *)RationalConstantType::denominator(&local_f0);
              in_stack_fffffffffffffe7c =
                   getNumeralWeight::anon_class_1_0_00000001::operator()
                             (in_stack_fffffffffffffef0,
                              (IntegerConstantType *)
                              CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
              if (0 < iVar2 + in_stack_fffffffffffffe7c) {
                local_c = iVar2 + in_stack_fffffffffffffe7c + local_c;
              }
              local_cc = 0;
            }
            RealConstantType::~RealConstantType((RealConstantType *)0x844efe);
            RationalConstantType::~RationalConstantType
                      ((RationalConstantType *)in_stack_fffffffffffffe80);
          }
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x844f18);
        }
      }
      NonVariableIterator::~NonVariableIterator(in_stack_fffffffffffffe80);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffe80);
  }
  return local_c;
}

Assistant:

unsigned Clause::getNumeralWeight() const {
  unsigned res = 0;
  for (Literal* lit : iterLits()) {
    if (!lit->hasInterpretedConstants()) {
      continue;
    }
    NonVariableIterator nvi(lit);
    while (nvi.hasNext()) {
      const Term* t = nvi.next().term();
      if (t->arity() != 0 || t->isSort()) {
        continue;
      }
      IntegerConstantType intVal;
      auto intWeight = [](IntegerConstantType const& i) {
        return (i.abs().log2() - IntegerConstantType(1)).cvt<int>()
          .orElse([&]() { return std::numeric_limits<int>::max(); });
      };

      if (theory->tryInterpretConstant(t, intVal)) {
        int w = intWeight(intVal);
        if (w > 0) {
          res += w;
        }
        continue;
      }
      RationalConstantType ratVal;
      RealConstantType realVal;
      bool haveRat = false;

      if (theory->tryInterpretConstant(t, ratVal)) {
        haveRat = true;
      } else if (theory->tryInterpretConstant(t, realVal)) {
        ratVal = RationalConstantType(realVal);
        haveRat = true;
      }
      if (!haveRat) {
        continue;
      }
      int wN = intWeight(ratVal.numerator());
      int wD = intWeight(ratVal.denominator());
      int v = wN + wD;
      if (v > 0) {
        res += v;
      }
    }
  }
  return res;
}